

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtCountOnesInCofsFast_rec(word *pTruth,int iVar,int nWords,int *pStore)

{
  word *pwVar1;
  int w_1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint nWords_00;
  
  if (nWords == 1) {
    if (iVar == 5) {
      iVar2 = Abc_TtCountOnesInCofsFast6_rec(*pTruth,5,8,pStore);
      return iVar2;
    }
    __assert_fail("iVar == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x217,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
  }
  if (1 < nWords) {
    if (iVar < 6) {
      __assert_fail("iVar > 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x21b,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
    }
    if ((*pTruth & 1) == 0) {
      uVar4 = 0;
      do {
        if ((uint)nWords == uVar4) {
          return 0;
        }
        pwVar1 = pTruth + uVar4;
        uVar4 = uVar4 + 1;
      } while (*pwVar1 == 0);
    }
    else {
      uVar4 = 0;
      do {
        if ((uint)nWords == uVar4) {
          for (uVar4 = 0; iVar + 1 != uVar4; uVar4 = uVar4 + 1) {
            pStore[uVar4] = pStore[uVar4] + nWords * 0x20;
          }
          return nWords << 6;
        }
        pwVar1 = pTruth + uVar4;
        uVar4 = uVar4 + 1;
      } while (*pwVar1 == 0xffffffffffffffff);
    }
    nWords_00 = (uint)nWords >> 1;
    iVar2 = Abc_TtCountOnesInCofsFast_rec(pTruth,iVar + -1,nWords_00,pStore);
    iVar3 = Abc_TtCountOnesInCofsFast_rec(pTruth + nWords_00,iVar + -1,nWords_00,pStore);
    pStore[(uint)iVar] = pStore[(uint)iVar] + iVar2;
    return iVar3 + iVar2;
  }
  __assert_fail("nWords > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                ,0x21a,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
}

Assistant:

int Abc_TtCountOnesInCofsFast_rec( word * pTruth, int iVar, int nWords, int * pStore )
{
    int nMints0, nMints1;
    if ( nWords == 1 )
    {
        assert( iVar == 5 );
        return Abc_TtCountOnesInCofsFast6_rec( pTruth[0], iVar, 8, pStore );
    }
    assert( nWords > 1 );
    assert( iVar > 5 );
    if ( pTruth[0] & 1 )
    {
        if ( Abc_TtIsConst1( pTruth, nWords ) )
        {
            int i;
            for ( i = 0; i <= iVar; i++ )
                pStore[i] += nWords * 32;
            return nWords * 64;
        }
    }
    else 
    {
        if ( Abc_TtIsConst0( pTruth, nWords ) )
            return 0;
    }
    nMints0 = Abc_TtCountOnesInCofsFast_rec( pTruth,            iVar - 1, nWords/2, pStore );
    nMints1 = Abc_TtCountOnesInCofsFast_rec( pTruth + nWords/2, iVar - 1, nWords/2, pStore );
    pStore[iVar] += nMints0;
    return nMints0 + nMints1;
}